

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog.c
# Opt level: O1

int xmlACatalogRemove(xmlCatalogPtr catal,xmlChar *value)

{
  xmlCatalogEntryPtr catal_00;
  _xmlCatalogEntry *p_Var1;
  xmlChar *pxVar2;
  xmlGenericErrorFunc p_Var3;
  int iVar4;
  xmlGenericErrorFunc *pp_Var5;
  void **ppvVar6;
  
  iVar4 = -1;
  if (value != (xmlChar *)0x0 && catal != (xmlCatalogPtr)0x0) {
    if (catal->type == XML_XML_CATALOG_TYPE) {
      catal_00 = catal->xml;
      if ((catal_00 != (xmlCatalogEntryPtr)0x0) && ((uint)(catal_00->type + XML_CATA_REMOVED) < 2))
      {
        if (catal_00->children == (_xmlCatalogEntry *)0x0) {
          xmlFetchXMLCatalogFile(catal_00);
        }
        for (p_Var1 = catal_00->children; p_Var1 != (_xmlCatalogEntry *)0x0; p_Var1 = p_Var1->next)
        {
          if (((p_Var1->name != (xmlChar *)0x0) &&
              (iVar4 = xmlStrEqual(value,p_Var1->name), iVar4 != 0)) ||
             (iVar4 = xmlStrEqual(value,p_Var1->value), iVar4 != 0)) {
            if (xmlDebugCatalogs != 0) {
              pxVar2 = p_Var1->name;
              pp_Var5 = __xmlGenericError();
              p_Var3 = *pp_Var5;
              ppvVar6 = __xmlGenericErrorContext();
              (*p_Var3)(*ppvVar6,"Removing element %s from catalog\n",
                        (&p_Var1->name)[pxVar2 == (xmlChar *)0x0]);
            }
            p_Var1->type = XML_CATA_REMOVED;
          }
        }
        iVar4 = 0;
      }
    }
    else {
      iVar4 = xmlHashRemoveEntry(catal->sgml,value,xmlFreeCatalogEntry);
      iVar4 = iVar4 + (uint)(iVar4 == 0);
    }
  }
  return iVar4;
}

Assistant:

int
xmlACatalogRemove(xmlCatalogPtr catal, const xmlChar *value) {
    int res = -1;

    if ((catal == NULL) || (value == NULL))
	return(-1);

    if (catal->type == XML_XML_CATALOG_TYPE) {
	res = xmlDelXMLCatalog(catal->xml, value);
    } else {
	res = xmlHashRemoveEntry(catal->sgml, value, xmlFreeCatalogEntry);
	if (res == 0)
	    res = 1;
    }
    return(res);
}